

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O0

int coda_ascii_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  coda_type *local_458;
  char local_449;
  long lStack_448;
  char buffer_3 [1];
  int64_t byte_size_1;
  int64_t byte_offset_2;
  int64_t available_bytes_1;
  long lStack_428;
  char buffer_2 [1];
  int64_t byte_size;
  int64_t byte_offset_1;
  int64_t available_bytes;
  long index;
  long top_index;
  long bottom_index;
  long *asciiline_end_offset;
  int64_t byte_offset;
  char s [21];
  uint8_t buffer_1 [1];
  double value_2;
  uint64_t value_1;
  int64_t value;
  long size;
  coda_cursor spec_cursor;
  coda_type *base_type;
  long lStack_90;
  int use_buffer;
  long buffer_size;
  char buffer [64];
  long local_40;
  int64_t bit_size_boundary;
  int64_t bit_offset;
  coda_ascii_mappings *mappings;
  coda_type *type;
  int64_t *bit_size_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_458 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_458 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  mappings = (coda_ascii_mappings *)local_458;
  bit_offset = 0;
  bit_size_boundary = cursor->stack[cursor->n + -1].bit_offset;
  lStack_90 = -1;
  bVar5 = false;
  if (-1 < local_458->bit_size) {
    *bit_size = local_458->bit_size;
    return 0;
  }
  type = (coda_type *)bit_size;
  bit_size_local = (int64_t *)cursor;
  if ((local_458->type_class == 0) || (local_458->type_class == 1)) {
    iVar2 = coda_ascbin_cursor_get_bit_size(cursor,bit_size);
    return iVar2;
  }
  iVar2 = get_bit_size_boundary(cursor,&local_40,-1);
  if (iVar2 != 0) {
    return -1;
  }
  if ((mappings->num_mappings == 2) || (mappings->num_mappings == 3)) {
    bit_offset = *(int64_t *)&mappings[3].num_mappings;
    bVar5 = true;
    if (bit_offset == 0) {
      bVar5 = mappings[1].mapping == (coda_ascii_mapping **)0x0;
    }
  }
  else if (mappings->num_mappings == 4) {
    if ((mappings[1].mapping == (coda_ascii_mapping **)0x0) && (*(int *)&mappings[2].mapping == 0))
    {
      type->format = (undefined4)local_40;
      type->retain_count = local_40._4_4_;
      return 0;
    }
    bVar5 = mappings[1].mapping == (coda_ascii_mapping **)0x0;
  }
  else if ((mappings->num_mappings == 6) && (mappings[2].num_mappings == 2)) {
    spec_cursor.stack[0x1f].bit_offset = (int64_t)mappings[2].mapping;
    if (*(int *)(spec_cursor.stack[0x1f].bit_offset + 8) != 4) {
      __assert_fail("base_type->type_class == coda_text_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x2be,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    if (*(int *)(spec_cursor.stack[0x1f].bit_offset + 0x40) == 0) {
      type->format = (undefined4)local_40;
      type->retain_count = local_40._4_4_;
      return 0;
    }
  }
  if (bVar5) {
    lStack_90 = local_40 >> 3;
    if (0x3f < lStack_90) {
      lStack_90 = 0x40;
    }
    iVar2 = read_bytes_in_bounds
                      ((coda_product *)*bit_size_local,bit_size_boundary >> 3,lStack_90,&buffer_size
                      );
    if (iVar2 != 0) {
      return -1;
    }
  }
  if ((bit_offset != 0) &&
     (iVar2 = parse_mapping_size((char *)&buffer_size,lStack_90,(coda_ascii_mappings *)bit_offset,
                                 (int64_t *)type), iVar2 != 0)) {
    return 0;
  }
  if (mappings->num_mappings == 6) {
    memcpy(&size,bit_size_local,0x310);
    iVar2 = coda_cursor_use_base_type_of_special_type((coda_cursor *)&size);
    if (iVar2 == 0) {
      iVar2 = coda_cursor_get_bit_size((coda_cursor *)&size,(int64_t *)type);
      return iVar2;
    }
    return -1;
  }
  if (mappings[1].mapping != (coda_ascii_mapping **)0x0) {
    iVar2 = coda_expression_eval_integer
                      ((coda_expression *)mappings[1].mapping,(coda_cursor *)bit_size_local,
                       (int64_t *)type);
    if (iVar2 != 0) {
      coda_add_error_message(" for size expression");
      coda_cursor_add_to_error_message((coda_cursor *)bit_size_local);
      return -1;
    }
    if (*(long *)&mappings[1].num_mappings == -8) {
      lVar3._0_4_ = type->format;
      lVar3._4_4_ = type->retain_count;
      type->format = (int)(lVar3 << 3);
      type->retain_count = (int)((ulong)(lVar3 << 3) >> 0x20);
    }
    lVar4._0_4_ = type->format;
    lVar4._4_4_ = type->retain_count;
    if (-1 < lVar4) {
      return 0;
    }
    uVar1._0_4_ = type->format;
    uVar1._4_4_ = type->retain_count;
    coda_set_error(-300,"calculated size is negative (%ld bits)",uVar1);
    coda_cursor_add_to_error_message((coda_cursor *)bit_size_local);
    return -1;
  }
  if ((mappings->num_mappings != 2) && (mappings->num_mappings != 3)) {
    if (mappings->num_mappings != 4) {
      __assert_fail("type->type_class == coda_text_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x335,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    }
    switch(*(undefined4 *)&mappings[2].mapping) {
    case 0:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                    ,0x40f,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
    case 1:
      if (*(int *)(*bit_size_local + 0x10) != 0) {
        __assert_fail("cursor->product->format == coda_format_ascii",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                      ,0x339,"int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      iVar2 = *(int *)(*bit_size_local + 0x50);
      if (iVar2 == 0) {
        if ((bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] & 7U) != 0) {
          coda_set_error(-300,
                         "product error detected (ascii line separator does not start at byte boundary)"
                        );
          return -1;
        }
        iVar2 = coda_ascii_cursor_read_bytes((coda_cursor *)bit_size_local,(uint8_t *)(s + 0xf),0,1)
        ;
        if (iVar2 != 0) {
          return -1;
        }
        if (s[0xf] == '\n') {
          type->format = coda_format_rinex;
          type->retain_count = 0;
          *(undefined4 *)(*bit_size_local + 0x50) = 1;
        }
        else {
          if (s[0xf] != '\r') {
            coda_str64(bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] >> 3,
                       (char *)&byte_offset);
            coda_set_error(-300,
                           "product error detected (invalid end-of-line sequence - not a carriage return or linefeed character - byte offset = %s)"
                           ,&byte_offset);
            return -1;
          }
          if (1 < *(long *)(*bit_size_local + 8) -
                  (bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] >> 3)) {
            iVar2 = coda_ascii_cursor_read_bytes
                              ((coda_cursor *)bit_size_local,(uint8_t *)(s + 0xf),1,1);
            if (iVar2 != 0) {
              return -1;
            }
            if (s[0xf] == '\n') {
              type->format = 0x10;
              type->retain_count = 0;
              *(undefined4 *)(*bit_size_local + 0x50) = 3;
              return 0;
            }
          }
          type->format = coda_format_rinex;
          type->retain_count = 0;
          *(undefined4 *)(*bit_size_local + 0x50) = 2;
        }
      }
      else if (iVar2 - 1U < 2) {
        type->format = coda_format_rinex;
        type->retain_count = 0;
      }
      else if (iVar2 == 3) {
        type->format = 0x10;
        type->retain_count = 0;
      }
      break;
    case 2:
    case 3:
      if (*(int *)(*bit_size_local + 0x10) == 0) {
        if ((bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] & 7U) != 0) {
          coda_set_error(-300,"product error detected (ascii line does not start at byte boundary)")
          ;
          return -1;
        }
        if ((*(long *)(*bit_size_local + 0x60) == 0) &&
           (iVar2 = coda_ascii_init_asciilines((coda_product *)*bit_size_local), iVar2 != 0)) {
          return -1;
        }
        if (*(long *)(*bit_size_local + 0x58) == 0) {
          coda_set_error(-0x12d,"trying to read from an empty file");
          return -1;
        }
        top_index = 0;
        lVar3 = *(long *)(*bit_size_local + 0x58) + -1;
        while (index = lVar3, index != top_index) {
          lVar3 = (top_index + index) / 2;
          if (*(long *)(*(long *)(*bit_size_local + 0x60) + lVar3 * 8) <=
              bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] >> 3) {
            top_index = lVar3 + 1;
            lVar3 = index;
          }
        }
        *(long *)type =
             (*(long *)(*(long *)(*bit_size_local + 0x60) + index * 8) -
             (bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] >> 3)) * 8;
        if ((*(int *)&mappings[2].mapping == 3) &&
           (((index != *(long *)(*bit_size_local + 0x58) + -1 ||
             (*(int *)(*bit_size_local + 0x68) != 0)) &&
            (*(long *)type = *(long *)type + -8, *(int *)(*bit_size_local + 0x50) == 3)))) {
          *(long *)type = *(long *)type + -8;
        }
      }
      else {
        if ((bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] & 7U) != 0) {
          coda_set_error(-300,"product error detected (ascii line does not start at byte boundary)")
          ;
          return -1;
        }
        lVar3 = bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] >> 3;
        lVar4 = *(long *)(*bit_size_local + 8) - lVar3;
        for (lStack_428 = 0; lStack_428 < lVar4; lStack_428 = lStack_428 + 1) {
          iVar2 = read_bytes_in_bounds
                            ((coda_product *)*bit_size_local,lVar3 + lStack_428,1,
                             (void *)((long)&available_bytes_1 + 7));
          if (iVar2 != 0) {
            return -1;
          }
          if ((available_bytes_1._7_1_ == '\r') || (available_bytes_1._7_1_ == '\n')) break;
        }
        if (*(int *)&mappings[2].mapping == 2) {
          if ((available_bytes_1._7_1_ == '\r') && (lStack_428 + 1 < lVar4)) {
            iVar2 = read_bytes_in_bounds
                              ((coda_product *)*bit_size_local,lVar3 + lStack_428 + 1,1,
                               (void *)((long)&available_bytes_1 + 7));
            if (iVar2 != 0) {
              return -1;
            }
            if (available_bytes_1._7_1_ == '\n') {
              lStack_428 = lStack_428 + 1;
            }
          }
          lStack_428 = lStack_428 + 1;
        }
        type->format = (int)(lStack_428 << 3);
        type->retain_count = (int)((ulong)(lStack_428 << 3) >> 0x20);
      }
      break;
    case 4:
      if ((bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4] & 7U) != 0) {
        coda_set_error(-300,
                       "product error detected (ascii white space does not start at byte boundary)")
        ;
        return -1;
      }
      lVar3 = bit_size_local[(long)((int)bit_size_local[1] + -1) * 3 + 4];
      lVar4 = *(long *)(*bit_size_local + 8);
      for (lStack_448 = 0; lStack_448 < lVar4 - (lVar3 >> 3); lStack_448 = lStack_448 + 1) {
        iVar2 = read_bytes_in_bounds
                          ((coda_product *)*bit_size_local,(lVar3 >> 3) + lStack_448,1,&local_449);
        if (iVar2 != 0) {
          return -1;
        }
        if ((local_449 != ' ') && (local_449 != '\t')) break;
      }
      type->format = (int)(lStack_448 << 3);
      type->retain_count = (int)((ulong)(lStack_448 << 3) >> 0x20);
    }
    return 0;
  }
  iVar2 = *(int *)&mappings->field_0xc;
  if (iVar2 == 0) {
LAB_00169a69:
    value = coda_ascii_parse_int64((char *)&buffer_size,lStack_90,(int64_t *)&value_1,1);
  }
  else {
    if (iVar2 != 1) {
      if (iVar2 == 2) goto LAB_00169a69;
      if (iVar2 != 3) {
        if (iVar2 == 4) goto LAB_00169a69;
        if (iVar2 != 5) {
          if (iVar2 == 6) goto LAB_00169a69;
          if (iVar2 != 7) {
            if (1 < iVar2 - 8U) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                            ,0x329,
                            "int coda_ascii_cursor_get_bit_size(const coda_cursor *, int64_t *)");
            }
            value = coda_ascii_parse_double((char *)&buffer_size,lStack_90,(double *)(s + 0x10),1);
            goto LAB_00169af7;
          }
        }
      }
    }
    value = coda_ascii_parse_uint64((char *)&buffer_size,lStack_90,(uint64_t *)&value_2,1);
  }
LAB_00169af7:
  if (value < 0) {
    cursor_local._4_4_ = -1;
  }
  else {
    type->format = (int)(value << 3);
    type->retain_count = (int)((ulong)(value << 3) >> 0x20);
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascii_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    coda_ascii_mappings *mappings = NULL;
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t bit_size_boundary;
    char buffer[MAX_ASCII_NUMBER_LENGTH];
    long buffer_size = -1;
    int use_buffer = 0;


    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
        return 0;
    }

    if (type->type_class == coda_record_class || type->type_class == coda_array_class)
    {
        return coda_ascbin_cursor_get_bit_size(cursor, bit_size);
    }

    if (get_bit_size_boundary(cursor, &bit_size_boundary, -1) != 0)
    {
        return -1;
    }

    /* determine if there are ascii mappings */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        mappings = ((coda_type_number *)type)->mappings;
        use_buffer = (mappings != NULL || type->size_expr == NULL);
    }
    else if (type->type_class == coda_text_class)
    {
        if (type->size_expr == NULL && ((coda_type_text *)type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
        use_buffer = (type->size_expr == NULL);
    }
    else if (type->type_class == coda_special_class && ((coda_type_special *)type)->special_type == coda_special_time)
    {
        coda_type *base_type = ((coda_type_special *)type)->base_type;

        assert(base_type->type_class == coda_text_class);
        if (((coda_type_text *)base_type)->special_text_type == ascii_text_default)
        {
            *bit_size = bit_size_boundary;
            return 0;
        }
    }

    /* only read buffer when we are dealing with numbers (without size_expr) or if there are mappings */
    if (use_buffer)
    {
        if (bit_size_boundary >> 3 < MAX_ASCII_NUMBER_LENGTH)
        {
            buffer_size = (long)(bit_size_boundary >> 3);
        }
        else
        {
            buffer_size = MAX_ASCII_NUMBER_LENGTH;
        }

        if (read_bytes_in_bounds(cursor->product, bit_offset >> 3, buffer_size, buffer) != 0)
        {
            return -1;
        }
    }

    if (mappings != NULL)
    {
        /* try to determine size from ascii mappings */
        /* TODO: this goes wrong if we have a mapping with a string length that exceeds MAX_ASCII_NUMBER_LENGTH
         * so we should actually also take into account the max mapping length when determining buffer_size */
        if (parse_mapping_size(buffer, buffer_size, mappings, bit_size))
        {
            return 0;
        }
    }

    if (type->type_class == coda_special_class)
    {
        coda_cursor spec_cursor;

        spec_cursor = *cursor;
        if (coda_cursor_use_base_type_of_special_type(&spec_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_get_bit_size(&spec_cursor, bit_size);
    }

    if (type->size_expr != NULL)
    {
        if (coda_expression_eval_integer(type->size_expr, cursor, bit_size) != 0)
        {
            coda_add_error_message(" for size expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        if (type->bit_size == -8)
        {
            /* convert byte size to bit size */
            *bit_size *= 8;
        }
        if (*bit_size < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)", (long)*bit_size);
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    /* parse the data to determine the size */
    if (type->type_class == coda_integer_class || type->type_class == coda_real_class)
    {
        long size;

        switch (type->read_type)
        {
            case coda_native_type_int8:
            case coda_native_type_int16:
            case coda_native_type_int32:
            case coda_native_type_int64:
                {
                    int64_t value;

                    size = coda_ascii_parse_int64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_uint8:
            case coda_native_type_uint16:
            case coda_native_type_uint32:
            case coda_native_type_uint64:
                {
                    uint64_t value;

                    size = coda_ascii_parse_uint64(buffer, buffer_size, &value, 1);
                }
                break;
            case coda_native_type_float:
            case coda_native_type_double:
                {
                    double value;

                    size = coda_ascii_parse_double(buffer, buffer_size, &value, 1);
                }
                break;
            default:
                assert(0);
                exit(1);
        }
        if (size < 0)
        {
            return -1;
        }
        *bit_size = size * 8;
        return 0;
    }

    /* only possible case left is the special text types */
    assert(type->type_class == coda_text_class);
    switch (((coda_type_text *)type)->special_text_type)
    {
        case ascii_text_line_separator:
            assert(cursor->product->format == coda_format_ascii);
            switch (((coda_ascii_product *)cursor->product)->end_of_line)
            {
                case eol_lf:
                case eol_cr:
                    *bit_size = 8;
                    break;
                case eol_crlf:
                    *bit_size = 16;
                    break;
                case eol_unknown:
                    {
                        uint8_t buffer[1];

                        /* accept either LINEFEED, CARRIAGE_RETURN, or CARRIAGE-RETURN/LINEFEED */

                        if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (ascii line separator does not "
                                           "start at byte boundary)");
                            return -1;
                        }
                        if (coda_ascii_cursor_read_bytes(cursor, buffer, 0, 1) != 0)
                        {
                            return -1;
                        }

                        switch (*buffer)
                        {
                            case '\n': /* linefeed */
                                /* just a linefeed -> unix platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_lf;
                                break;
                            case '\r': /* carriage return */
                                if (cursor->product->file_size - (cursor->stack[cursor->n - 1].bit_offset >> 3) >= 2)
                                {
                                    if (coda_ascii_cursor_read_bytes(cursor, buffer, 1, 1) != 0)
                                    {
                                        return -1;
                                    }
                                    if (*buffer == '\n')
                                    {
                                        /* carriage return followed by linefeed -> dos platform convention */
                                        *bit_size = 16;
                                        ((coda_ascii_product *)cursor->product)->end_of_line = eol_crlf;
                                        break;
                                    }
                                }
                                /* just a carriage return -> mac platform convention */
                                *bit_size = 8;
                                ((coda_ascii_product *)cursor->product)->end_of_line = eol_cr;
                                break;
                            default:
                                {
                                    char s[21];

                                    coda_str64(cursor->stack[cursor->n - 1].bit_offset >> 3, s);
                                    coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid end-of-line "
                                                   "sequence - not a carriage return or linefeed character - byte "
                                                   "offset = %s)", s);
                                    return -1;
                                }
                        }
                    }
            }
            break;
        case ascii_text_line_with_eol:
        case ascii_text_line_without_eol:
            if (cursor->product->format == coda_format_ascii)
            {
                int64_t byte_offset;
                long *asciiline_end_offset;
                long bottom_index;
                long top_index;

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }

                if (((coda_ascii_product *)cursor->product)->asciiline_end_offset == NULL)
                {
                    if (coda_ascii_init_asciilines(cursor->product) != 0)
                    {
                        return -1;
                    }
                }
                if (((coda_ascii_product *)cursor->product)->num_asciilines == 0)
                {
                    coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read from an empty file");
                    return -1;
                }

                bottom_index = 0;
                top_index = ((coda_ascii_product *)cursor->product)->num_asciilines - 1;
                asciiline_end_offset = ((coda_ascii_product *)cursor->product)->asciiline_end_offset;
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;

                while (top_index != bottom_index)
                {
                    long index;

                    index = (bottom_index + top_index) / 2;
                    if (byte_offset < asciiline_end_offset[index])
                    {
                        top_index = index;
                    }
                    else
                    {
                        bottom_index = index + 1;
                    }
                }
                *bit_size = ((asciiline_end_offset[top_index] - byte_offset) << 3);

                /* remove length of eol if eol was not included in the asciiline type */
                /* and if the line does not end with eof */
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_without_eol)
                {
                    if (!(top_index == ((coda_ascii_product *)cursor->product)->num_asciilines - 1 &&
                          ((coda_ascii_product *)cursor->product)->lastline_ending == eol_unknown))
                    {
                        *bit_size -= 8;
                        if (((coda_ascii_product *)cursor->product)->end_of_line == eol_crlf)
                        {
                            *bit_size -= 8;
                        }
                    }
                }
            }
            else
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                /* not a pure ascii file -> don't use asciiline cache */

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii line does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer == '\r' || *buffer == '\n')
                    {
                        break;
                    }
                    byte_size++;
                }
                if (((coda_type_text *)type)->special_text_type == ascii_text_line_with_eol)
                {
                    if (*buffer == '\r' && byte_size + 1 < available_bytes)
                    {
                        if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size + 1, 1, buffer) != 0)
                        {
                            return -1;
                        }
                        if (*buffer == '\n')
                        {
                            byte_size++;
                        }
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_whitespace:
            {
                int64_t available_bytes;
                int64_t byte_offset;
                int64_t byte_size;
                char buffer[1];

                if ((cursor->stack[cursor->n - 1].bit_offset & 0x7) != 0)
                {
                    coda_set_error(CODA_ERROR_PRODUCT,
                                   "product error detected (ascii white space does not start at byte boundary)");
                    return -1;
                }
                byte_offset = cursor->stack[cursor->n - 1].bit_offset >> 3;
                available_bytes = cursor->product->file_size - byte_offset;
                byte_size = 0;

                while (byte_size < available_bytes)
                {
                    if (read_bytes_in_bounds(cursor->product, byte_offset + byte_size, 1, buffer) != 0)
                    {
                        return -1;
                    }
                    if (*buffer != ' ' && *buffer != '\t')
                    {
                        break;
                    }
                    byte_size++;
                }
                *bit_size = (byte_size << 3);
            }
            break;
        case ascii_text_default:
            assert(0);
            exit(1);
    }

    return 0;
}